

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O2

void duckdb::PragmaQueries::RegisterFunction(BuiltinFunctions *set)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  allocator_type local_153a;
  allocator local_1539;
  undefined1 local_1538 [48];
  string local_1508;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_14e8;
  LogicalType local_14c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_14b0;
  LogicalType local_1498;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1480;
  LogicalType local_1468;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1450;
  LogicalType local_1438;
  LogicalType local_1420;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1408;
  LogicalType local_13f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_13d8;
  PragmaFunction local_13c0;
  PragmaFunction local_12a8;
  PragmaFunction local_1190;
  PragmaFunction local_1078;
  PragmaFunction local_f60;
  PragmaFunction local_e48;
  PragmaFunction local_d30;
  PragmaFunction local_c18;
  PragmaFunction local_b00;
  PragmaFunction local_9e8;
  PragmaFunction local_8d0;
  PragmaFunction local_7b8;
  PragmaFunction local_6a0;
  PragmaFunction local_588;
  PragmaFunction local_470;
  PragmaFunction local_358;
  PragmaFunction local_240;
  PragmaFunction local_128;
  
  ::std::__cxx11::string::string((string *)local_1538,"table_info",&local_1539);
  LogicalType::LogicalType((LogicalType *)&local_1508,VARCHAR);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1508;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_13d8,__l,&local_153a);
  LogicalType::LogicalType(&local_13f0,INVALID);
  PragmaFunction::PragmaCall
            (&local_128,(string *)local_1538,PragmaTableInfo_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_13d8,&local_13f0);
  BuiltinFunctions::AddFunction(set,&local_128);
  PragmaFunction::~PragmaFunction(&local_128);
  LogicalType::~LogicalType(&local_13f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_13d8);
  LogicalType::~LogicalType((LogicalType *)&local_1508);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"storage_info",&local_1539);
  LogicalType::LogicalType((LogicalType *)&local_1508,VARCHAR);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_1508;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1408,__l_00,&local_153a);
  LogicalType::LogicalType(&local_1420,INVALID);
  PragmaFunction::PragmaCall
            (&local_240,(string *)local_1538,PragmaStorageInfo_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_1408,&local_1420);
  BuiltinFunctions::AddFunction(set,&local_240);
  PragmaFunction::~PragmaFunction(&local_240);
  LogicalType::~LogicalType(&local_1420);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1408);
  LogicalType::~LogicalType((LogicalType *)&local_1508);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"metadata_info",(allocator *)&local_1508);
  local_14e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_1438,INVALID);
  PragmaFunction::PragmaCall
            (&local_358,(string *)local_1538,PragmaMetadataInfo_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_14e8,&local_1438);
  BuiltinFunctions::AddFunction(set,&local_358);
  PragmaFunction::~PragmaFunction(&local_358);
  LogicalType::~LogicalType(&local_1438);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_14e8);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"show_tables",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_470,(string *)local_1538,PragmaShowTables_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_470);
  PragmaFunction::~PragmaFunction(&local_470);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string
            ((string *)local_1538,"show_tables_expanded",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement
            (&local_588,(string *)local_1538,PragmaShowTablesExpanded_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_588);
  PragmaFunction::~PragmaFunction(&local_588);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"show_databases",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_6a0,(string *)local_1538,PragmaShowDatabases_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_6a0);
  PragmaFunction::~PragmaFunction(&local_6a0);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"database_list",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_7b8,(string *)local_1538,PragmaDatabaseList_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_7b8);
  PragmaFunction::~PragmaFunction(&local_7b8);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"collations",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_8d0,(string *)local_1538,PragmaCollations_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_8d0);
  PragmaFunction::~PragmaFunction(&local_8d0);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"show",&local_1539);
  LogicalType::LogicalType((LogicalType *)&local_1508,VARCHAR);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_1508;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1450,__l_01,&local_153a);
  LogicalType::LogicalType(&local_1468,INVALID);
  PragmaFunction::PragmaCall
            (&local_9e8,(string *)local_1538,PragmaShow_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_1450,&local_1468);
  BuiltinFunctions::AddFunction(set,&local_9e8);
  PragmaFunction::~PragmaFunction(&local_9e8);
  LogicalType::~LogicalType(&local_1468);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1450);
  LogicalType::~LogicalType((LogicalType *)&local_1508);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"version",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_b00,(string *)local_1538,PragmaVersion_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_b00);
  PragmaFunction::~PragmaFunction(&local_b00);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"extension_versions",(allocator *)&local_1508)
  ;
  PragmaFunction::PragmaStatement
            (&local_c18,(string *)local_1538,PragmaExtensionVersions_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_c18);
  PragmaFunction::~PragmaFunction(&local_c18);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"platform",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_d30,(string *)local_1538,PragmaPlatform_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_d30);
  PragmaFunction::~PragmaFunction(&local_d30);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"database_size",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_e48,(string *)local_1538,PragmaDatabaseSize_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_e48);
  PragmaFunction::~PragmaFunction(&local_e48);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"functions",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_f60,(string *)local_1538,PragmaFunctionsQuery_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_f60);
  PragmaFunction::~PragmaFunction(&local_f60);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"import_database",&local_1539);
  LogicalType::LogicalType((LogicalType *)&local_1508,VARCHAR);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_1508;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1480,__l_02,&local_153a);
  LogicalType::LogicalType(&local_1498,INVALID);
  PragmaFunction::PragmaCall
            (&local_1078,(string *)local_1538,PragmaImportDatabase_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_1480,&local_1498);
  BuiltinFunctions::AddFunction(set,&local_1078);
  PragmaFunction::~PragmaFunction(&local_1078);
  LogicalType::~LogicalType(&local_1498);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1480);
  LogicalType::~LogicalType((LogicalType *)&local_1508);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)&local_1508,"copy_database",&local_1539);
  LogicalType::LogicalType((LogicalType *)local_1538,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_1538 + 0x18),VARCHAR);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_1538;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_14b0,__l_03,&local_153a);
  LogicalType::LogicalType(&local_14c8,INVALID);
  PragmaFunction::PragmaCall
            (&local_1190,&local_1508,PragmaCopyDatabase_abi_cxx11_,
             (vector<duckdb::LogicalType,_true> *)&local_14b0,&local_14c8);
  BuiltinFunctions::AddFunction(set,&local_1190);
  PragmaFunction::~PragmaFunction(&local_1190);
  LogicalType::~LogicalType(&local_14c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_14b0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1538 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_1508);
  ::std::__cxx11::string::string
            ((string *)local_1538,"all_profiling_output",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_12a8,(string *)local_1538,PragmaAllProfiling_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_12a8);
  PragmaFunction::~PragmaFunction(&local_12a8);
  ::std::__cxx11::string::~string((string *)local_1538);
  ::std::__cxx11::string::string((string *)local_1538,"user_agent",(allocator *)&local_1508);
  PragmaFunction::PragmaStatement(&local_13c0,(string *)local_1538,PragmaUserAgent_abi_cxx11_);
  BuiltinFunctions::AddFunction(set,&local_13c0);
  PragmaFunction::~PragmaFunction(&local_13c0);
  ::std::__cxx11::string::~string((string *)local_1538);
  return;
}

Assistant:

void PragmaQueries::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(PragmaFunction::PragmaCall("table_info", PragmaTableInfo, {LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaCall("storage_info", PragmaStorageInfo, {LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaCall("metadata_info", PragmaMetadataInfo, {}));
	set.AddFunction(PragmaFunction::PragmaStatement("show_tables", PragmaShowTables));
	set.AddFunction(PragmaFunction::PragmaStatement("show_tables_expanded", PragmaShowTablesExpanded));
	set.AddFunction(PragmaFunction::PragmaStatement("show_databases", PragmaShowDatabases));
	set.AddFunction(PragmaFunction::PragmaStatement("database_list", PragmaDatabaseList));
	set.AddFunction(PragmaFunction::PragmaStatement("collations", PragmaCollations));
	set.AddFunction(PragmaFunction::PragmaCall("show", PragmaShow, {LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaStatement("version", PragmaVersion));
	set.AddFunction(PragmaFunction::PragmaStatement("extension_versions", PragmaExtensionVersions));
	set.AddFunction(PragmaFunction::PragmaStatement("platform", PragmaPlatform));
	set.AddFunction(PragmaFunction::PragmaStatement("database_size", PragmaDatabaseSize));
	set.AddFunction(PragmaFunction::PragmaStatement("functions", PragmaFunctionsQuery));
	set.AddFunction(PragmaFunction::PragmaCall("import_database", PragmaImportDatabase, {LogicalType::VARCHAR}));
	set.AddFunction(
	    PragmaFunction::PragmaCall("copy_database", PragmaCopyDatabase, {LogicalType::VARCHAR, LogicalType::VARCHAR}));
	set.AddFunction(PragmaFunction::PragmaStatement("all_profiling_output", PragmaAllProfiling));
	set.AddFunction(PragmaFunction::PragmaStatement("user_agent", PragmaUserAgent));
}